

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O1

void __thiscall
Buffer_change_event_add_hton_u8_Test::TestBody(Buffer_change_event_add_hton_u8_Test *this)

{
  void *pvVar1;
  size_t sVar2;
  char *pcVar3;
  initializer_list<bfy_changed_cb_info> __l;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  BufferWithReadonlyStrings local;
  allocator_type local_111;
  AssertHelper local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  undefined1 local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  pointer local_f0;
  bfy_changed_cb_info local_e8;
  BufferWithReadonlyStrings local_d0;
  
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_d0);
  sVar2 = bfy_buffer_get_content_len(&local_d0.buf);
  bfy_buffer_set_changed_cb
            (&local_d0.buf,
             (anonymous_namespace)::BufferWithReadonlyStrings::start_listening_to_changes()::
             {lambda(auto:1*,auto:2_const*,void*)#1}::__invoke<bfy_buffer,bfy_changed_cb_info>,
             &local_d0.changes);
  local_e8.orig_size = (ulong)local_e8.orig_size._4_4_ << 0x20;
  local_110.data_._0_4_ = bfy_buffer_add_hton_u8(&local_d0.buf,0x80);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_100,"0","bfy_buffer_add_hton_u8(&local.buf, addme)",(int *)&local_e8,
             (int *)&local_110);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_f8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x569,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_e8.orig_size != (long *)0x0) {
      (**(code **)(*(long *)local_e8.orig_size + 8))();
    }
  }
  if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,local_f8);
  }
  local_e8.n_added = 1;
  local_e8.n_deleted = 0;
  __l._M_len = 1;
  __l._M_array = &local_e8;
  local_e8.orig_size = sVar2;
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
            ((vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)local_100,__l,
             &local_111);
  testing::internal::
  CmpHelperEQ<std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>,std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>>
            ((internal *)&local_110,"changes_t{expected}","local.changes",
             (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)local_100,
             &local_d0.changes);
  pvVar1 = (void *)CONCAT71(local_100._1_7_,local_100[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_f0 - (long)pvVar1);
  }
  if (local_110.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x56a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((long *)CONCAT71(local_100._1_7_,local_100[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_100._1_7_,local_100[0]) + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_d0);
  return;
}

Assistant:

TEST(Buffer, change_event_add_hton_u8) {
    BufferWithReadonlyStrings local;
    auto constexpr addme = uint8_t { 128 };
    auto constexpr size = sizeof(addme);
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = size,
        .n_deleted = 0
    };

    local.start_listening_to_changes();
    EXPECT_EQ(0, bfy_buffer_add_hton_u8(&local.buf, addme));
    EXPECT_EQ(changes_t{expected}, local.changes);
}